

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

DataType __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingNegativeCase::getSamplerTexCoordType
          (SamplerBindingNegativeCase *this)

{
  int iVar1;
  SamplerBindingNegativeCase *this_local;
  
  iVar1 = *(int *)&(this->super_LayoutBindingNegativeCase).field_0x134;
  if (iVar1 == 0x8b5e) {
    this_local._4_4_ = TYPE_FLOAT_VEC2;
  }
  else if (iVar1 == 0x8b5f) {
    this_local._4_4_ = TYPE_FLOAT_VEC3;
  }
  else {
    this_local._4_4_ = TYPE_INVALID;
  }
  return this_local._4_4_;
}

Assistant:

glu::DataType SamplerBindingNegativeCase::getSamplerTexCoordType(void) const
{
	switch (m_samplerType)
	{
		case GL_SAMPLER_2D:
			return glu::TYPE_FLOAT_VEC2;

		case GL_SAMPLER_3D:
			return glu::TYPE_FLOAT_VEC3;

		default:
			DE_ASSERT(false);
			return glu::TYPE_INVALID;
	}
}